

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# saigStrSim.c
# Opt level: O0

void Saig_StrSimTableInsert(Aig_Obj_t **ppTable,Aig_Obj_t **ppNexts,int nTableSize,Aig_Obj_t *pObj)

{
  uint uVar1;
  Aig_Obj_t *pNext;
  int iEntry;
  Aig_Obj_t *pObj_local;
  int nTableSize_local;
  Aig_Obj_t **ppNexts_local;
  Aig_Obj_t **ppTable_local;
  
  uVar1 = Saig_StrSimHash(pObj);
  uVar1 = uVar1 % (uint)nTableSize;
  if (ppTable[(int)uVar1] == (Aig_Obj_t *)0x0) {
    ppTable[(int)uVar1] = pObj;
  }
  else {
    pNext = Saig_ObjNext(ppNexts,ppTable[(int)uVar1]);
    Saig_ObjSetNext(ppNexts,pObj,pNext);
    Saig_ObjSetNext(ppNexts,ppTable[(int)uVar1],pObj);
  }
  return;
}

Assistant:

void Saig_StrSimTableInsert( Aig_Obj_t ** ppTable, Aig_Obj_t ** ppNexts, int nTableSize, Aig_Obj_t * pObj )
{
    // find the hash entry
    int iEntry = Saig_StrSimHash( pObj ) % nTableSize;
    // check if there are nodes with this signatures
    if ( ppTable[iEntry] == NULL )
        ppTable[iEntry] = pObj;
    else
    {
        Saig_ObjSetNext( ppNexts, pObj, Saig_ObjNext(ppNexts, ppTable[iEntry]) );
        Saig_ObjSetNext( ppNexts, ppTable[iEntry], pObj );
    }
}